

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::DistExpression::fromSyntax
          (Compilation *comp,ExpressionOrDistSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  size_type sVar2;
  DistWeightSyntax *pDVar3;
  Type *args;
  Expression *args_1;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  DistConstraintListSyntax *pDVar8;
  DistItemSyntax *pDVar9;
  ExpressionSyntax *pEVar10;
  reference ppEVar11;
  undefined4 extraout_var;
  ulong uVar12;
  undefined4 extraout_var_00;
  DistExpression *expr;
  ParentList *pPVar13;
  EVP_PKEY_CTX *src;
  SeparatedSyntaxList<slang::syntax::DistItemSyntax> *pSVar14;
  size_type index;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffe58;
  iterator __begin2_1;
  DistItem local_178;
  pointer local_158;
  size_type sStack_150;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL> items;
  
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_ =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                firstElement;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len = 0;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.cap = 5;
  pDVar8 = not_null<slang::syntax::DistConstraintListSyntax_*>::get(&syntax->distribution);
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len = 0;
  sVar2 = (pDVar8->items).elements.size_;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.data_ = (pointer)&pDVar8->items;
  for (; ((SeparatedSyntaxList<slang::syntax::DistItemSyntax> *)
          items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.data_ != &pDVar8->items
         || (items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len != sVar2 + 1 >> 1
            )); items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len =
                     items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len + 1) {
    pDVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::
             iterator_base<slang::syntax::DistItemSyntax_*>::operator*
                       ((iterator_base<slang::syntax::DistItemSyntax_*> *)&items);
    bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
         (pointer)not_null<slang::syntax::ExpressionSyntax_*>::get(&pDVar9->range);
    SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
    emplace_back<slang::syntax::ExpressionSyntax_const*>
              ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&expressions,
               (ExpressionSyntax **)&bound);
  }
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expr);
  local_158 = expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_;
  sStack_150 = expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
  expressions_00.size_ = (size_type)&bound;
  expressions_00.data_ =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
  bVar5 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0x8b,EndOfFile,false,false,true,
                     SUB81(pEVar10,0),
                     (ExpressionSyntax *)
                     expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                     data_,expressions_00,in_stack_fffffffffffffe58);
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.data_ =
       (pointer)items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.firstElement;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len = 0;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.cap = 4;
  pDVar8 = not_null<slang::syntax::DistConstraintListSyntax_*>::get(&syntax->distribution);
  bVar5 = !bVar5;
  pSVar14 = &pDVar8->items;
  __begin2_1.index = 0;
  __begin2_1.list = pSVar14;
  sVar2 = (pDVar8->items).elements.size_;
  index = 1;
  uVar12 = 0;
  pPVar13 = pSVar14;
  while ((pPVar13 != pSVar14 || (uVar12 != sVar2 + 1 >> 1))) {
    pDVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::
             iterator_base<slang::syntax::DistItemSyntax_*>::operator*(&__begin2_1);
    ppEVar11 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                         (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>,index);
    local_178.value = *ppEVar11;
    local_178.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
         false;
    pDVar3 = pDVar9->weight;
    if (pDVar3 != (DistWeightSyntax *)0x0) {
      TVar1 = (pDVar3->op).kind;
      pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pDVar3->expr);
      iVar7 = Expression::bind((int)pEVar10,(sockaddr *)context,0);
      uVar4 = local_178.weight.
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._0_8_;
      local_178.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr = (Expression *)CONCAT44(extraout_var,iVar7);
      local_178.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.kind._1_3_ = 0;
      local_178.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.kind._0_1_ = TVar1 == ColonSlash;
      local_178.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _4_4_ = SUB84(uVar4,4);
      local_178.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           true;
      bVar6 = ASTContext::requireIntegral
                        (context,local_178.weight.
                                 super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<slang::ast::DistExpression::DistWeight>
                                 ._M_payload._M_value.expr);
      bVar5 = (bool)(bVar5 | !bVar6);
    }
    SmallVectorBase<slang::ast::DistExpression::DistItem>::
    emplace_back<slang::ast::DistExpression::DistItem&>
              (&items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>,&local_178);
    uVar12 = __begin2_1.index + 1;
    __begin2_1.index = uVar12;
    index = index + 1;
    pPVar13 = __begin2_1.list;
  }
  args = comp->voidType;
  ppEVar11 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                       (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>,0);
  args_1 = *ppEVar11;
  iVar7 = SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
                    (&items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>,
                     (EVP_PKEY_CTX *)comp,src);
  local_178.value = (Expression *)CONCAT44(extraout_var_00,iVar7);
  __begin2_1 = (iterator)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,slang::SourceRange>
                   (&comp->super_BumpAllocator,args,args_1,
                    (span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)&local_178
                    ,(SourceRange *)&__begin2_1);
  if (bVar5) {
    expr = (DistExpression *)Expression::badExpr(comp,&expr->super_Expression);
  }
  SmallVectorBase<slang::ast::DistExpression::DistItem>::~SmallVectorBase
            (&items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>);
  SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
            (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>);
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::~SmallVectorBase
            (&expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>);
  return &expr->super_Expression;
}

Assistant:

Expression& DistExpression::fromSyntax(Compilation& comp, const ExpressionOrDistSyntax& syntax,
                                       const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto item : syntax.distribution->items)
        expressions.push_back(item->range);

    SmallVector<const Expression*> bound;
    bool bad =
        !bindMembershipExpressions(context, TokenKind::DistKeyword, /* requireIntegral */ true,
                                   /* unwrapUnpacked */ false, /* allowTypeReferences */ false,
                                   /* allowOpenRange */ true, *syntax.expr, expressions, bound);

    SmallVector<DistItem, 4> items;
    size_t index = 1;
    for (auto item : syntax.distribution->items) {
        DistItem di{*bound[index++], {}};
        if (item->weight) {
            auto weightKind = item->weight->op.kind == TokenKind::ColonSlash ? DistWeight::PerRange
                                                                             : DistWeight::PerValue;
            auto& weightExpr = Expression::bind(*item->weight->expr, context);
            di.weight.emplace(DistWeight{weightKind, weightExpr});

            if (!context.requireIntegral(weightExpr))
                bad = true;
        }

        items.emplace_back(di);
    }

    auto result = comp.emplace<DistExpression>(comp.getVoidType(), *bound[0], items.copy(comp),
                                               syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    return *result;
}